

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMMInterpreter.cpp
# Opt level: O0

BasicValue * __thiscall
cmm::CMMInterpreter::callUserFunction
          (BasicValue *__return_storage_ptr__,CMMInterpreter *this,FunctionDefinitionAST *Function,
          list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *Args,VariableEnv *Env)

{
  ExecutionResultKind EVar1;
  VariableEnv *this_00;
  bool bVar2;
  ExecutionResultKind EVar3;
  BasicType BVar4;
  size_type sVar5;
  size_t sVar6;
  string *psVar7;
  list<cmm::Parameter,_std::allocator<cmm::Parameter>_> *plVar8;
  pointer pPVar9;
  ulong uVar10;
  StatementAST *Stmt;
  BasicType Type;
  BasicType Type_00;
  BasicType Type_01;
  BasicType Type_02;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cvm::BasicValue>_>,_bool>
  pVar11;
  VariableEnv *local_438;
  string local_400;
  string local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  undefined1 local_320 [8];
  ExecutionResult Result;
  string local_2c8;
  string local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  reference local_1a8;
  BasicValue *Arg;
  iterator __end1;
  iterator __begin1;
  list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *__range1;
  const_iterator End;
  const_iterator It;
  VariableEnv FuncEnv;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  VariableEnv *local_30;
  VariableEnv *Env_local;
  list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *Args_local;
  FunctionDefinitionAST *Function_local;
  CMMInterpreter *this_local;
  
  local_30 = Env;
  Env_local = (VariableEnv *)Args;
  Args_local = (list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *)Function;
  Function_local = (FunctionDefinitionAST *)this;
  this_local = (CMMInterpreter *)__return_storage_ptr__;
  sVar5 = std::__cxx11::list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>::size(Args);
  sVar6 = FunctionDefinitionAST::getParameterCount((FunctionDefinitionAST *)Args_local);
  if (sVar5 != sVar6) {
    psVar7 = FunctionDefinitionAST::getName_abi_cxx11_((FunctionDefinitionAST *)Args_local);
    std::operator+(&local_f0,"Function `",psVar7);
    std::operator+(&local_d0,&local_f0,"\' expects ");
    sVar6 = FunctionDefinitionAST::getParameterCount((FunctionDefinitionAST *)Args_local);
    std::__cxx11::to_string(&local_120,sVar6);
    std::operator+(&local_b0,&local_d0,&local_120);
    std::operator+(&local_90,&local_b0," parameter(s), ");
    sVar5 = std::__cxx11::list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>::size
                      ((list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *)Env_local);
    std::__cxx11::to_string
              ((string *)&FuncEnv.VarMap._M_t._M_impl.super__Rb_tree_header._M_node_count,sVar5);
    std::operator+(&local_70,&local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &FuncEnv.VarMap._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::operator+(&local_50,&local_70," argument(s) provided");
    RuntimeError(this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string
              ((string *)&FuncEnv.VarMap._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
  }
  if (local_30 == (VariableEnv *)0x0) {
    local_438 = &this->TopLevelEnv;
  }
  else {
    local_438 = local_30;
  }
  VariableEnv::VariableEnv((VariableEnv *)&It,local_438);
  plVar8 = FunctionDefinitionAST::getParameterList_abi_cxx11_((FunctionDefinitionAST *)Args_local);
  End = std::__cxx11::list<cmm::Parameter,_std::allocator<cmm::Parameter>_>::cbegin(plVar8);
  plVar8 = FunctionDefinitionAST::getParameterList_abi_cxx11_((FunctionDefinitionAST *)Args_local);
  std::__cxx11::list<cmm::Parameter,_std::allocator<cmm::Parameter>_>::cend(plVar8);
  this_00 = Env_local;
  __end1 = std::__cxx11::list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>::begin
                     ((list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *)Env_local);
  Arg = (BasicValue *)
        std::__cxx11::list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>::end
                  ((list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *)this_00);
  do {
    bVar2 = std::operator!=(&__end1,(_Self *)&Arg);
    if (!bVar2) {
      Stmt = FunctionDefinitionAST::getStatement((FunctionDefinitionAST *)Args_local);
      executeStatement((ExecutionResult *)local_320,this,(VariableEnv *)&It,Stmt);
      EVar1 = Result.Kind;
      if ((local_320._0_4_ == ReturnStatementResult) &&
         (EVar3 = FunctionDefinitionAST::getType((FunctionDefinitionAST *)Args_local),
         EVar1 != EVar3)) {
        psVar7 = FunctionDefinitionAST::getName_abi_cxx11_((FunctionDefinitionAST *)Args_local);
        std::operator+(&local_3c0,"function `",psVar7);
        std::operator+(&local_3a0,&local_3c0,"\' ought to return ");
        BVar4 = FunctionDefinitionAST::getType((FunctionDefinitionAST *)Args_local);
        cvm::TypeToStr_abi_cxx11_(&local_3e0,(cvm *)(ulong)BVar4,Type_01);
        std::operator+(&local_380,&local_3a0,&local_3e0);
        std::operator+(&local_360,&local_380,", but got ");
        cvm::TypeToStr_abi_cxx11_(&local_400,(cvm *)(ulong)Result.Kind,Type_02);
        std::operator+(&local_340,&local_360,&local_400);
        RuntimeError(this,&local_340);
        std::__cxx11::string::~string((string *)&local_340);
        std::__cxx11::string::~string((string *)&local_400);
        std::__cxx11::string::~string((string *)&local_360);
        std::__cxx11::string::~string((string *)&local_380);
        std::__cxx11::string::~string((string *)&local_3e0);
        std::__cxx11::string::~string((string *)&local_3a0);
        std::__cxx11::string::~string((string *)&local_3c0);
      }
      cvm::BasicValue::BasicValue(__return_storage_ptr__,(BasicValue *)&Result);
      ExecutionResult::~ExecutionResult((ExecutionResult *)local_320);
      VariableEnv::~VariableEnv((VariableEnv *)&It);
      return __return_storage_ptr__;
    }
    local_1a8 = std::_List_iterator<cvm::BasicValue>::operator*(&__end1);
    pPVar9 = std::_List_const_iterator<cmm::Parameter>::operator->(&End);
    BVar4 = Parameter::getType(pPVar9);
    if (BVar4 != local_1a8->Type) {
      bVar2 = cvm::BasicValue::isInt(local_1a8);
      if (bVar2) {
        pPVar9 = std::_List_const_iterator<cmm::Parameter>::operator->(&End);
        BVar4 = Parameter::getType(pPVar9);
        if (BVar4 == DoubleType) {
          (local_1a8->field_2).DoubleVal = (double)(local_1a8->field_2).IntVal;
          local_1a8->Type = DoubleType;
          goto LAB_00116d65;
        }
      }
      psVar7 = FunctionDefinitionAST::getName_abi_cxx11_((FunctionDefinitionAST *)Args_local);
      std::operator+(&local_288,"in function `",psVar7);
      std::operator+(&local_268,&local_288,"\', parameter `");
      pPVar9 = std::_List_const_iterator<cmm::Parameter>::operator->(&End);
      psVar7 = Parameter::getName_abi_cxx11_(pPVar9);
      std::operator+(&local_248,&local_268,psVar7);
      std::operator+(&local_228,&local_248,"\' has type ");
      pPVar9 = std::_List_const_iterator<cmm::Parameter>::operator->(&End);
      BVar4 = Parameter::getType(pPVar9);
      cvm::TypeToStr_abi_cxx11_(&local_2a8,(cvm *)(ulong)BVar4,Type);
      std::operator+(&local_208,&local_228,&local_2a8);
      std::operator+(&local_1e8,&local_208,", but argument is ");
      cvm::TypeToStr_abi_cxx11_(&local_2c8,(cvm *)(ulong)local_1a8->Type,Type_00);
      std::operator+(&local_1c8,&local_1e8,&local_2c8);
      RuntimeError(this,&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_2c8);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)&local_288);
    }
LAB_00116d65:
    pPVar9 = std::_List_const_iterator<cmm::Parameter>::operator->(&End);
    Parameter::getName_abi_cxx11_(pPVar9);
    uVar10 = std::__cxx11::string::empty();
    if ((uVar10 & 1) == 0) {
      pPVar9 = std::_List_const_iterator<cmm::Parameter>::operator->(&End);
      psVar7 = Parameter::getName_abi_cxx11_(pPVar9);
      pVar11 = std::
               map<std::__cxx11::string,cvm::BasicValue,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cvm::BasicValue>>>
               ::emplace<std::__cxx11::string_const&,cvm::BasicValue&>
                         ((map<std::__cxx11::string,cvm::BasicValue,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cvm::BasicValue>>>
                           *)&FuncEnv,psVar7,local_1a8);
      Result.ReturnValue.ArrayPtr.
      super___shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pVar11.first._M_node;
    }
    std::_List_const_iterator<cmm::Parameter>::operator++(&End);
    std::_List_iterator<cvm::BasicValue>::operator++(&__end1);
  } while( true );
}

Assistant:

cvm::BasicValue
CMMInterpreter::callUserFunction(const FunctionDefinitionAST &Function,
                                 std::list<cvm::BasicValue> &Args,
                                 VariableEnv *Env) {
  if (Args.size() != Function.getParameterCount()) {
    RuntimeError("Function `" + Function.getName() + "' expects " +
        std::to_string(Function.getParameterCount()) + " parameter(s), " +
        std::to_string(Args.size()) + " argument(s) provided");
  }

  VariableEnv FuncEnv(Env ? Env : &TopLevelEnv);

  auto It = Function.getParameterList().cbegin();
  auto End = Function.getParameterList().cend();
  for (cvm::BasicValue &Arg : Args) {
    if (It->getType() != Arg.Type) {
      if (Arg.isInt() && It->getType() == cvm::DoubleType) {
        Arg.DoubleVal = Arg.IntVal;
        Arg.Type = cvm::DoubleType;
      } else {
        RuntimeError("in function `" + Function.getName() + "', parameter `" +
          It->getName() + "' has type " + cvm::TypeToStr(It->getType()) +
          ", but argument is " + cvm::TypeToStr(Arg.Type));
      }
    }

    if (!It->getName().empty()) // We allow empty parameter name.
      FuncEnv.VarMap.emplace(It->getName(), Arg);
    ++It;
  }

  ExecutionResult Result = executeStatement(&FuncEnv, Function.getStatement());
  if (Result.Kind == ExecutionResult::ReturnStatementResult &&
      Result.ReturnValue.Type != Function.getType()) {
    RuntimeError("function `" + Function.getName() + "' ought to return " +
        cvm::TypeToStr(Function.getType()) + ", but got " +
        cvm::TypeToStr(Result.ReturnValue.Type));
  }
  return Result.ReturnValue;
}